

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opcodes.cpp
# Opt level: O0

void Opcodes::run(SFLAG_Register *sfr,GEN_Register *gr,RAM *mem,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *cmd)

{
  uint8_t uVar1;
  reference pvVar2;
  string local_50;
  uint8_t local_29;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_28;
  uint8_t opcodeNumber;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmd_local;
  RAM *mem_local;
  GEN_Register *gr_local;
  SFLAG_Register *sfr_local;
  
  pvStack_28 = cmd;
  cmd_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)mem;
  mem_local = (RAM *)gr;
  gr_local = (GEN_Register *)sfr;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](cmd,0);
  std::__cxx11::string::string((string *)&local_50,(string *)pvVar2);
  uVar1 = getHexOpcode(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (uVar1 != '\0') {
    local_29 = uVar1;
    if (uVar1 == '7') {
      AAA((SFLAG_Register *)gr_local,(GEN_Register *)mem_local,(RAM *)cmd_local,pvStack_28);
    }
    else if (uVar1 == 0x80) {
      ADD((SFLAG_Register *)gr_local,(GEN_Register *)mem_local,(RAM *)cmd_local,pvStack_28);
    }
  }
  return;
}

Assistant:

void Opcodes::run(SFLAG_Register &sfr, GEN_Register &gr, RAM &mem, std::vector<std::string> &cmd) {
    // Get the numeric opcode.
    uint8_t opcodeNumber = Opcodes::getHexOpcode(cmd[0]);
    // Check to see if the opcode is valid.
    if (opcodeNumber == 0x0) {
        // This opcode is not valid. Return for now.
        // TODO: Throw a triple-step error.
        return;
    }
    // Opcode is valid, compare it against the list of added opcode functions.
    switch (opcodeNumber) {
        case 0x37:
            AAA(sfr, gr, mem, cmd);
            break;
        case 0x80:
            ADD(sfr, gr, mem, cmd);
            break;
        default:
            break;
    }
}